

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O3

uint __thiscall
QFragmentMapData<QTextBlockData>::previous(QFragmentMapData<QTextBlockData> *this,uint n)

{
  uint uVar1;
  Header *pHVar2;
  uint uVar3;
  uint *puVar4;
  bool bVar5;
  
  pHVar2 = (this->field_0).head;
  if (n == 0) {
    uVar1 = pHVar2->root;
    do {
      uVar3 = uVar1;
      if (uVar3 == 0) {
        return 0;
      }
      uVar1 = *(uint *)((long)pHVar2 + (ulong)uVar3 * 0x48 + 8);
    } while (uVar1 != 0);
  }
  else {
    uVar1 = *(uint *)((long)pHVar2 + (ulong)n * 0x48 + 4);
    if (uVar1 == 0) {
      puVar4 = (uint *)((long)pHVar2 + (ulong)n * 0x48);
      do {
        uVar3 = *puVar4;
        if (*(int *)((long)pHVar2 + (ulong)n * 0x48) == 0) {
          return uVar3;
        }
        puVar4 = (uint *)((long)pHVar2 + (ulong)uVar3 * 0x48);
        bVar5 = n == puVar4[1];
        n = uVar3;
      } while (bVar5);
    }
    else {
      do {
        uVar3 = uVar1;
        uVar1 = *(uint *)((long)pHVar2 + (ulong)uVar3 * 0x48 + 8);
      } while (uVar1 != 0);
    }
  }
  return uVar3;
}

Assistant:

uint QFragmentMapData<Fragment>::previous(uint n) const {
    if (!n)
        return maximum(root());

    if (F(n).left) {
        n = F(n).left;
        while (F(n).right)
            n = F(n).right;
    } else {
        uint y = F(n).parent;
        while (F(n).parent && n == F(y).left) {
            n = y;
            y = F(y).parent;
        }
        n = y;
    }
    return n;
}